

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fDitheringTests.cpp
# Opt level: O2

bool __thiscall
deqp::gles3::Functional::DitheringCase::checkColor
          (DitheringCase *this,Vec4 *inputClr,RGBA *renderedClr,bool logErrors)

{
  deUint32 dVar1;
  ostringstream *poVar2;
  int *piVar3;
  bool bVar4;
  deUint32 dVar5;
  MessageBuilder *pMVar6;
  int iVar7;
  ulong uVar8;
  ulong uVar9;
  long lVar10;
  long lVar11;
  deUint32 dVar12;
  int iVar13;
  uint uVar14;
  float __x;
  float fVar15;
  float fVar16;
  vector<int,_std::allocator<int>_> channelChoices;
  undefined1 *local_3a0;
  undefined8 local_398;
  undefined1 local_390 [16];
  RGBA *local_380;
  undefined8 local_378;
  undefined8 uStack_370;
  undefined1 local_368 [16];
  string local_350;
  undefined1 local_330 [8];
  ostream local_328;
  undefined1 local_1b0 [384];
  
  local_378._0_4_ = (this->m_renderFormat).redBits;
  local_378._4_4_ = (this->m_renderFormat).greenBits;
  uStack_370._0_4_ = (this->m_renderFormat).blueBits;
  uStack_370._4_4_ = (this->m_renderFormat).alphaBits;
  bVar4 = true;
  lVar10 = 0;
  local_380 = renderedClr;
  while( true ) {
    if (lVar10 == 4) {
      return bVar4;
    }
    iVar13 = *(int *)((long)&local_378 + lVar10 * 4);
    if (iVar13 != 0) break;
LAB_010bd236:
    lVar10 = lVar10 + 1;
  }
  iVar13 = 1 << ((byte)iVar13 & 0x1f);
  dVar1 = iVar13 - 1;
  __x = (float)(int)dVar1 * inputClr->m_data[lVar10];
  fVar15 = floorf(__x + 0.5);
  channelChoices.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  channelChoices.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  channelChoices.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  fVar16 = ceilf(__x);
  dVar12 = (deUint32)fVar16;
  dVar5 = dVar12;
  if ((int)dVar1 < (int)dVar12) {
    dVar5 = dVar1;
  }
  local_330._0_4_ = dVar5;
  std::vector<int,_std::allocator<int>_>::emplace_back<int>(&channelChoices,(int *)local_330);
  local_330._0_4_ = dVar12 - 1;
  if ((int)local_330._0_4_ < 1) {
    local_330._0_4_ = 0;
  }
  std::vector<int,_std::allocator<int>_>::emplace_back<int>(&channelChoices,(int *)local_330);
  fVar16 = __x - fVar15;
  uVar14 = -(uint)(-fVar16 <= fVar16);
  fVar16 = (float)(~uVar14 & (uint)-fVar16 | (uint)fVar16 & uVar14);
  local_368 = ZEXT416((uint)fVar16);
  if (fVar16 < 0.0001) {
    if (__x <= fVar15) {
      local_330._0_4_ = dVar12 + 1;
      std::vector<int,_std::allocator<int>_>::emplace_back<int>(&channelChoices,(int *)local_330);
    }
    else {
      local_330._0_4_ = dVar12 - 2;
      std::vector<int,_std::allocator<int>_>::emplace_back<int>(&channelChoices,(int *)local_330);
    }
  }
  std::
  __sort<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,__gnu_cxx::__ops::_Iter_less_iter>
            (channelChoices.super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start,
             channelChoices.super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_finish);
  tcu::RGBA::toIVec((RGBA *)local_330);
  fVar15 = floorf((float)(int)(dVar1 * *(int *)(local_330 + lVar10 * 4)) / 255.0 + 0.5);
  uVar8 = (ulong)((long)channelChoices.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_finish -
                 (long)channelChoices.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_start) >> 2;
  uVar9 = uVar8 & 0xffffffff;
  if ((int)uVar8 < 1) {
    uVar9 = 0;
  }
  uVar8 = 0;
LAB_010bcf73:
  if (uVar9 != uVar8) goto code_r0x010bcf78;
  if (logErrors) {
    local_1b0._0_8_ = ((this->super_TestCase).super_TestNode.m_testCtx)->m_log;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)(local_1b0 + 8));
    std::operator<<((ostream *)(local_1b0 + 8),"Failure: ");
    pMVar6 = tcu::MessageBuilder::operator<<
                       ((MessageBuilder *)local_1b0,(int *)((long)&local_378 + lVar10 * 4));
    std::operator<<(&(pMVar6->m_str).super_basic_ostream<char,_std::char_traits<char>_>,"-bit ");
    pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,(char **)(s_channelNames + lVar10 * 8));
    poVar2 = &pMVar6->m_str;
    std::operator<<(&poVar2->super_basic_ostream<char,_std::char_traits<char>_>," channel is ");
    std::ostream::operator<<(poVar2,(int)fVar15);
    std::operator<<(&poVar2->super_basic_ostream<char,_std::char_traits<char>_>,", should be ");
    local_3a0 = local_390;
    local_398 = 0;
    local_390[0] = 0;
    lVar11 = 0;
    for (uVar8 = 0;
        iVar7 = (int)((ulong)((long)channelChoices.super__Vector_base<int,_std::allocator<int>_>.
                                    _M_impl.super__Vector_impl_data._M_finish -
                             (long)channelChoices.super__Vector_base<int,_std::allocator<int>_>.
                                   _M_impl.super__Vector_impl_data._M_start) >> 2),
        (long)uVar8 < (long)iVar7; uVar8 = uVar8 + 1) {
      if ((uVar8 == iVar7 - 1) || (lVar11 != 0)) {
        std::__cxx11::string::append((char *)&local_3a0);
      }
      de::toString<int>(&local_350,
                        (int *)((long)channelChoices.super__Vector_base<int,_std::allocator<int>_>.
                                      _M_impl.super__Vector_impl_data._M_start + lVar11));
      std::__cxx11::string::append((string *)&local_3a0);
      std::__cxx11::string::~string((string *)&local_350);
      lVar11 = lVar11 + 4;
    }
    std::operator<<(&poVar2->super_basic_ostream<char,_std::char_traits<char>_>,(string *)&local_3a0
                   );
    std::operator<<(&poVar2->super_basic_ostream<char,_std::char_traits<char>_>,
                    " (corresponding fragment color channel is ");
    pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,inputClr->m_data + lVar10);
    std::operator<<(&(pMVar6->m_str).super_basic_ostream<char,_std::char_traits<char>_>,")");
    local_330 = (undefined1  [8])
                tcu::MessageBuilder::operator<<(pMVar6,(EndMessageToken *)&tcu::TestLog::EndMessage)
    ;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_328);
    std::operator<<(&local_328,"Note: ");
    pMVar6 = tcu::MessageBuilder::operator<<((MessageBuilder *)local_330,inputClr->m_data + lVar10);
    poVar2 = &pMVar6->m_str;
    std::operator<<(&poVar2->super_basic_ostream<char,_std::char_traits<char>_>," * (");
    std::ostream::operator<<(poVar2,iVar13);
    std::operator<<(&poVar2->super_basic_ostream<char,_std::char_traits<char>_>,"-1) = ");
    std::ostream::operator<<(poVar2,__x);
    tcu::MessageBuilder::operator<<(pMVar6,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_328);
    std::__cxx11::string::~string((string *)&local_3a0);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)(local_1b0 + 8));
    if ((float)local_368._0_4_ < 0.0001) {
      local_330 = (undefined1  [8])((this->super_TestCase).super_TestNode.m_testCtx)->m_log;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_328);
      std::operator<<(&local_328,
                      "Note: one extra color candidate was allowed because fragmentColorChannel * (2^bits-1) is close to an integer"
                     );
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_330,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_328);
    }
  }
  bVar4 = false;
LAB_010bd21f:
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            (&channelChoices.super__Vector_base<int,_std::allocator<int>_>);
  goto LAB_010bd236;
code_r0x010bcf78:
  piVar3 = channelChoices.super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start + uVar8;
  uVar8 = uVar8 + 1;
  if (*piVar3 == (int)fVar15) goto LAB_010bd21f;
  goto LAB_010bcf73;
}

Assistant:

bool DitheringCase::checkColor (const Vec4& inputClr, const tcu::RGBA& renderedClr, const bool logErrors) const
{
	const IVec4		channelBits		= pixelFormatToIVec4(m_renderFormat);
	bool			allChannelsOk	= true;

	for (int chanNdx = 0; chanNdx < 4; chanNdx++)
	{
		if (channelBits[chanNdx] == 0)
			continue;

		const int		channelMax			= (1 << channelBits[chanNdx]) - 1;
		const float		scaledInput			= inputClr[chanNdx] * (float)channelMax;
		const bool		useRoundingMargin	= deFloatAbs(scaledInput - deFloatRound(scaledInput)) < 0.0001f;
		vector<int>		channelChoices;

		channelChoices.push_back(de::min(channelMax,	(int)deFloatCeil(scaledInput)));
		channelChoices.push_back(de::max(0,				(int)deFloatCeil(scaledInput) - 1));

		// If the input color results in a scaled value that is very close to an integer, account for a little bit of possible inaccuracy.
		if (useRoundingMargin)
		{
			if (scaledInput > deFloatRound(scaledInput))
				channelChoices.push_back((int)deFloatCeil(scaledInput) - 2);
			else
				channelChoices.push_back((int)deFloatCeil(scaledInput) + 1);
		}

		std::sort(channelChoices.begin(), channelChoices.end());

		{
			const int		renderedClrInFormat	= (int)deFloatRound((float)(renderedClr.toIVec()[chanNdx] * channelMax) / 255.0f);
			bool			goodChannel			= false;

			for (int i = 0; i < (int)channelChoices.size(); i++)
			{
				if (renderedClrInFormat == channelChoices[i])
				{
					goodChannel = true;
					break;
				}
			}

			if (!goodChannel)
			{
				if (logErrors)
				{
					m_testCtx.getLog() << TestLog::Message
									   << "Failure: " << channelBits[chanNdx] << "-bit " << s_channelNames[chanNdx] << " channel is " << renderedClrInFormat
									   << ", should be " << choiceListStr(channelChoices)
									   << " (corresponding fragment color channel is " << inputClr[chanNdx] << ")"
									   << TestLog::EndMessage
									   << TestLog::Message
									   << "Note: " << inputClr[chanNdx] << " * (" << channelMax + 1 << "-1) = " << scaledInput
									   << TestLog::EndMessage;

					if (useRoundingMargin)
					{
						m_testCtx.getLog() << TestLog::Message
										   << "Note: one extra color candidate was allowed because fragmentColorChannel * (2^bits-1) is close to an integer"
										   << TestLog::EndMessage;
					}
				}

				allChannelsOk = false;
			}
		}
	}

	return allChannelsOk;
}